

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

string * makeTempDir_abi_cxx11_(void)

{
  char *pcVar1;
  char *pcVar2;
  ostream *poVar3;
  size_t sVar4;
  int *piVar5;
  string *in_RDI;
  char local_1028 [4104];
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  memset(local_1028 + 0x17,0,0xfe9);
  builtin_strncpy(local_1028,"/var/tmp/OpenEXR_XXXXXX",0x17);
  pcVar2 = mkdtemp(local_1028);
  if (pcVar2 != (char *)0x0) {
    pcVar1 = (char *)in_RDI->_M_string_length;
    strlen(pcVar2);
    std::__cxx11::string::_M_replace((ulong)in_RDI,0,pcVar1,(ulong)pcVar2);
    std::__cxx11::string::append((char *)in_RDI);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"tempDir = \'",0xb);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(in_RDI->_M_dataplus)._M_p,in_RDI->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\': ",3);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    return in_RDI;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"ERROR: mkdtemp( \"",0x11);
  sVar4 = strlen(local_1028);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_1028,sVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\" failed: ",10);
  piVar5 = __errno_location();
  pcVar2 = strerror(*piVar5);
  poVar3 = std::operator<<((ostream *)&std::cerr,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(1);
}

Assistant:

std::string
makeTempDir ()
{
    std::string tempDir;
    for (int trycount = 0; trycount < 3; ++trycount)
    {
#ifdef _WIN32
        IMATH_NAMESPACE::Rand48 rand48 (time ((time_t*) 0));
        char                    tmpbuf[4096];
        DWORD                   len = GetTempPathA (4096, tmpbuf);
        if (len == 0 || len > 4095)
        {
            std::cerr << "Cannot retrieve temporary directory" << std::endl;
            exit (1);
        }
        tempDir = tmpbuf;
        // windows does this automatically
        // tempDir += IMF_PATH_SEPARATOR;
        tempDir += "OpenEXRTest_";

        for (int i = 0; i < 8; ++i)
            tempDir += ('A' + rand48.nexti () % 26);

        int status = _mkdir (tempDir.c_str ());

        if (status != 0)
        {
            std::cerr << "ERROR -- mkdir(" << tempDir
                      << ") failed: "
                         "errno = "
                      << errno << std::endl;
            if (errno == EEXIST) continue;
            if (trycount == 2) exit (1);
        }
#else
        char tmpbuf[4096];

        memset (tmpbuf, 0, 4096);
        const char* tmpdirname = IMF_TMP_DIR "OpenEXR_XXXXXX";
        size_t      tlen       = strlen (tmpdirname);
        memcpy (tmpbuf, tmpdirname, tlen);

        char* tmpd = mkdtemp (tmpbuf);
        if (tmpd) { tempDir = tmpd; }
        else
        {
            std::cerr << "ERROR: mkdtemp( \"" << tmpbuf
                      << "\" failed: " << strerror (errno) << std::endl;
            exit (1);
        }
        int status = 0;
#endif
        if (status == 0)
        {
            tempDir += IMF_PATH_SEPARATOR;

            std::cout << "tempDir = '" << tempDir << "': " << tempDir.size ()
                      << std::endl;
            break; // success
        }
    }

    return tempDir;
}